

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.cpp
# Opt level: O2

void __thiscall Calculator::loadFile(Calculator *this,string *fileName,bool printIfNotFound)

{
  char cVar1;
  ostream *poVar2;
  string line;
  ifstream stream;
  byte abStack_208 [488];
  
  std::ifstream::ifstream(&stream,(string *)fileName,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    if (printIfNotFound) {
      poVar2 = std::operator<<(this->mOutputStream,"Could not open the file \'");
      poVar2 = std::operator<<(poVar2,(string *)fileName);
      poVar2 = std::operator<<(poVar2,"\'.");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
  }
  else {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    while ((abStack_208[*(long *)(_stream + -0x18)] & 2) == 0) {
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&stream,(string *)&line);
      execute(this,&line,false);
    }
    std::__cxx11::string::~string((string *)&line);
  }
  std::ifstream::~ifstream(&stream);
  return;
}

Assistant:

void Calculator::loadFile(const std::string& fileName, bool printIfNotFound) {
	std::ifstream stream(fileName);

	if (stream.is_open()) {
		std::string line;

		while (!stream.eof()) {
			std::getline(stream, line);
			execute(line, false);
		}
	} else if (printIfNotFound) {
		mOutputStream << "Could not open the file '" << fileName << "'." << std::endl;
	}
}